

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  uint uVar1;
  ushort *puVar2;
  short *psVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  short sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  int iVar13;
  parasail_result_t *ppVar14;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar15;
  uint uVar16;
  __m128i *palVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  undefined2 uVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  int iVar28;
  ushort uVar29;
  undefined4 uVar31;
  undefined4 uVar32;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i alVar41;
  undefined1 auVar42 [16];
  ushort uVar49;
  short sVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ulong uVar54;
  ushort uVar55;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ushort uVar65;
  ushort uVar66;
  int iVar67;
  ushort uVar77;
  ushort uVar78;
  int iVar79;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  ushort uVar76;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  short sVar80;
  int iVar81;
  short sVar91;
  int iVar92;
  int iVar94;
  undefined1 auVar82 [16];
  int iVar95;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  short sVar90;
  short sVar93;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  long local_f8;
  ushort local_78;
  ushort uStack_76;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar30;
  short sVar50;
  undefined1 auVar86 [16];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_scan_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_table_scan_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_scan_profile_sse2_128_16_cold_6();
      }
      else {
        uVar16 = profile->s1Len;
        if ((int)uVar16 < 1) {
          parasail_nw_table_scan_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_scan_profile_sse2_128_16_cold_4();
        }
        else {
          uVar54 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_scan_profile_sse2_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_scan_profile_sse2_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_scan_profile_sse2_128_16_cold_1();
          }
          else {
            uVar12 = uVar16 - 1;
            uVar23 = (ulong)uVar16 + 7 >> 3;
            iVar13 = (int)(uVar12 / uVar23);
            uVar25 = -open;
            uVar26 = ppVar5->min;
            iVar28 = -uVar26;
            if (uVar26 != uVar25 && SBORROW4(uVar26,uVar25) == (int)(uVar26 + open) < 0) {
              iVar28 = open;
            }
            iVar19 = ppVar5->max;
            ppVar14 = parasail_result_new_table1((uint)((ulong)uVar16 + 7) & 0x7ffffff8,s2Len);
            if (ppVar14 != (parasail_result_t *)0x0) {
              ppVar14->flag = ppVar14->flag | 0x8220401;
              ptr = parasail_memalign___m128i(0x10,uVar23);
              ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m128i(0x10,uVar23);
              ptr_02 = parasail_memalign___m128i(0x10,uVar23);
              ptr_03 = parasail_memalign___m128i(0x10,uVar23);
              auVar33._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
              auVar33._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
              auVar33._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
              auVar33._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
              iVar15 = movmskps((int)ptr_00,auVar33);
              if (iVar15 != 0) {
                return (parasail_result_t *)0x0;
              }
              if (ptr_03 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              iVar15 = s2Len + -1;
              auVar33 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar31 = auVar33._0_4_;
              auVar53._4_4_ = uVar31;
              auVar53._0_4_ = uVar31;
              auVar53._8_4_ = uVar31;
              auVar53._12_4_ = uVar31;
              auVar33 = pshuflw(auVar33,ZEXT416((uint)gap),0);
              uVar31 = auVar33._0_4_;
              uVar16 = iVar28 - 0x7fff;
              auVar33 = pshuflw(ZEXT416(uVar16),ZEXT416(uVar16),0);
              uVar32 = auVar33._0_4_;
              auVar34 = ZEXT416(CONCAT22((short)(uVar26 >> 0x10),0x7ffe - (short)iVar19));
              auVar34 = pshuflw(auVar34,auVar34,0);
              auVar35 = ZEXT416((uint)-((int)uVar23 * gap));
              auVar35 = pshuflw(auVar35,auVar35,0);
              uVar26 = auVar35._0_4_;
              auVar35._0_8_ = CONCAT44(uVar26,uVar26);
              auVar35._8_4_ = uVar26;
              auVar35._12_4_ = uVar26;
              auVar42._0_8_ = auVar35._0_8_ << 0x10;
              auVar42._8_8_ = auVar35._8_8_ << 0x10 | (ulong)(uVar26 >> 0x10);
              auVar35 = paddsw(auVar42,ZEXT416(uVar16 & 0xffff));
              lVar18 = (long)(int)uVar25;
              uVar20 = 0;
              do {
                lVar27 = 0;
                lVar21 = lVar18;
                do {
                  uVar22 = 0x8000;
                  if (-0x8000 < lVar21) {
                    uVar22 = (undefined2)lVar21;
                  }
                  *(undefined2 *)((long)&local_48 + lVar27 * 2) = uVar22;
                  lVar24 = lVar21 - (ulong)(uint)open;
                  if (lVar24 < -0x7fff) {
                    lVar24 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar27 * 2) = (short)lVar24;
                  lVar27 = lVar27 + 1;
                  lVar21 = lVar21 - uVar23 * (uint)gap;
                } while (lVar27 != 8);
                ptr_02[uVar20][0] = local_48;
                ptr_02[uVar20][1] = lStack_40;
                ptr[uVar20][0] = local_58;
                ptr[uVar20][1] = lStack_50;
                uVar20 = uVar20 + 1;
                lVar18 = lVar18 - (ulong)(uint)gap;
              } while (uVar20 != uVar23);
              *ptr_00 = 0;
              auVar89 = _DAT_00904aa0;
              auVar42 = _DAT_00903aa0;
              lVar18 = uVar54 - 1;
              auVar82._8_4_ = (int)lVar18;
              auVar82._0_8_ = lVar18;
              auVar82._12_4_ = (int)((ulong)lVar18 >> 0x20);
              iVar19 = -gap;
              iVar28 = gap * 2;
              uVar20 = 0;
              auVar82 = auVar82 ^ _DAT_00903aa0;
              auVar73._8_4_ = 0xffffffff;
              auVar73._0_8_ = 0xffffffffffffffff;
              auVar73._12_4_ = 0xffffffff;
              uVar26 = uVar25;
              do {
                auVar38._0_4_ = (undefined4)uVar20;
                auVar101._8_4_ = auVar38._0_4_;
                auVar101._0_8_ = uVar20;
                auVar101._12_4_ = (int)(uVar20 >> 0x20);
                auVar36 = (auVar101 | _DAT_00903a90) ^ auVar42;
                iVar81 = auVar82._0_4_;
                iVar67 = -(uint)(iVar81 < auVar36._0_4_);
                iVar92 = auVar82._4_4_;
                auVar106._4_4_ = -(uint)(iVar92 < auVar36._4_4_);
                iVar94 = auVar82._8_4_;
                iVar79 = -(uint)(iVar94 < auVar36._8_4_);
                iVar95 = auVar82._12_4_;
                auVar106._12_4_ = -(uint)(iVar95 < auVar36._12_4_);
                auVar56._4_4_ = iVar67;
                auVar56._0_4_ = iVar67;
                auVar56._8_4_ = iVar79;
                auVar56._12_4_ = iVar79;
                auVar102 = pshuflw(in_XMM13,auVar56,0xe8);
                auVar103._0_4_ = -(uint)(auVar36._0_4_ == iVar81);
                auVar103._4_4_ = -(uint)(auVar36._4_4_ == iVar92);
                auVar103._8_4_ = -(uint)(auVar36._8_4_ == iVar94);
                auVar103._12_4_ = -(uint)(auVar36._12_4_ == iVar95);
                auVar105._4_4_ = auVar103._4_4_;
                auVar105._0_4_ = auVar103._4_4_;
                auVar105._8_4_ = auVar103._12_4_;
                auVar105._12_4_ = auVar103._12_4_;
                auVar99 = pshuflw(in_XMM9,auVar105,0xe8);
                auVar106._0_4_ = auVar106._4_4_;
                auVar106._8_4_ = auVar106._12_4_;
                auVar36 = pshuflw(auVar103,auVar106,0xe8);
                auVar36 = (auVar36 | auVar99 & auVar102) ^ auVar73;
                auVar36 = packssdw(auVar36,auVar36);
                uVar1 = gap * -3 + uVar26;
                auVar102._0_4_ = -(uint)(auVar89._0_4_ < (int)uVar26);
                auVar102._4_4_ = -(uint)(auVar89._4_4_ < iVar19 - open);
                auVar102._8_4_ = -(uint)(auVar89._8_4_ < (int)(uVar25 - iVar28));
                auVar102._12_4_ = -(uint)(auVar89._12_4_ < (int)uVar1);
                auVar99._0_4_ = uVar26 & auVar102._0_4_;
                auVar99._4_4_ = iVar19 - open & auVar102._4_4_;
                auVar99._8_4_ = uVar25 - iVar28 & auVar102._8_4_;
                auVar99._12_4_ = uVar1 & auVar102._12_4_;
                auVar103 = ~auVar102 & auVar89 | auVar99;
                if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar20 + 1] = auVar103._0_2_;
                }
                auVar106 = auVar105 & auVar56 | auVar106;
                auVar36 = packssdw(auVar106,auVar106);
                auVar36 = packssdw(auVar36 ^ auVar73,auVar36 ^ auVar73);
                if ((auVar36._0_4_ >> 0x10 & 1) != 0) {
                  ptr_00[uVar20 + 2] = auVar103._4_2_;
                }
                auVar56 = (auVar101 | _DAT_00903a80) ^ auVar42;
                iVar67 = -(uint)(iVar81 < auVar56._0_4_);
                auVar68._4_4_ = -(uint)(iVar92 < auVar56._4_4_);
                iVar79 = -(uint)(iVar94 < auVar56._8_4_);
                auVar68._12_4_ = -(uint)(iVar95 < auVar56._12_4_);
                auVar37._4_4_ = iVar67;
                auVar37._0_4_ = iVar67;
                auVar37._8_4_ = iVar79;
                auVar37._12_4_ = iVar79;
                auVar57._4_4_ = -(uint)(auVar56._4_4_ == iVar92);
                auVar57._12_4_ = -(uint)(auVar56._12_4_ == iVar95);
                auVar57._0_4_ = auVar57._4_4_;
                auVar57._8_4_ = auVar57._12_4_;
                auVar68._0_4_ = auVar68._4_4_;
                auVar68._8_4_ = auVar68._12_4_;
                auVar56 = auVar57 & auVar37 | auVar68;
                auVar56 = packssdw(auVar56,auVar56);
                auVar56 = packssdw(auVar56 ^ auVar73,auVar56 ^ auVar73);
                if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_00[uVar20 + 3] = auVar103._8_2_;
                }
                auVar56 = pshufhw(auVar37,auVar37,0x84);
                auVar102 = pshufhw(auVar57,auVar57,0x84);
                auVar106 = pshufhw(auVar56,auVar68,0x84);
                auVar56 = (auVar106 | auVar102 & auVar56) ^ auVar73;
                auVar56 = packssdw(auVar56,auVar56);
                if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_00[uVar20 + 4] = auVar103._12_2_;
                }
                auVar38._4_4_ = auVar38._0_4_;
                auVar38._8_4_ = auVar38._0_4_;
                auVar38._12_4_ = auVar38._0_4_;
                auVar38 = auVar38 | _DAT_00904a90;
                auVar96._4_4_ = gap;
                auVar96._0_4_ = gap;
                auVar96._8_4_ = gap;
                auVar96._12_4_ = gap;
                auVar69._0_4_ = uVar25 - auVar38._0_4_ * gap;
                auVar69._4_4_ = uVar25 - gap * auVar38._4_4_;
                auVar69._8_4_ = uVar25 - (int)((auVar38._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                auVar69._12_4_ =
                     uVar25 - (int)((auVar96._8_8_ & 0xffffffff) * (ulong)auVar38._12_4_);
                auVar104._0_4_ = -(uint)(auVar89._0_4_ < auVar69._0_4_);
                auVar104._4_4_ = -(uint)(auVar89._4_4_ < auVar69._4_4_);
                auVar104._8_4_ = -(uint)(auVar89._8_4_ < auVar69._8_4_);
                auVar104._12_4_ = -(uint)(auVar89._12_4_ < auVar69._12_4_);
                in_XMM13 = ~auVar104 & auVar89 | auVar69 & auVar104;
                auVar103 = (auVar101 | _DAT_00903ad0) ^ auVar42;
                auVar97._0_4_ = -(uint)(iVar81 < auVar103._0_4_);
                auVar97._4_4_ = -(uint)(iVar92 < auVar103._4_4_);
                auVar97._8_4_ = -(uint)(iVar94 < auVar103._8_4_);
                auVar97._12_4_ = -(uint)(iVar95 < auVar103._12_4_);
                auVar70._4_4_ = auVar97._0_4_;
                auVar70._0_4_ = auVar97._0_4_;
                auVar70._8_4_ = auVar97._8_4_;
                auVar70._12_4_ = auVar97._8_4_;
                in_XMM9 = pshuflw(auVar99,auVar70,0xe8);
                iVar67 = -(uint)(auVar103._4_4_ == iVar92);
                iVar79 = -(uint)(auVar103._12_4_ == iVar95);
                auVar39._4_4_ = iVar67;
                auVar39._0_4_ = iVar67;
                auVar39._8_4_ = iVar79;
                auVar39._12_4_ = iVar79;
                auVar38 = pshuflw(auVar36,auVar39,0xe8);
                auVar36._4_4_ = auVar97._4_4_;
                auVar36._0_4_ = auVar97._4_4_;
                auVar36._8_4_ = auVar97._12_4_;
                auVar36._12_4_ = auVar97._12_4_;
                auVar103 = pshuflw(auVar97,auVar36,0xe8);
                auVar103 = (auVar103 | auVar38 & in_XMM9) ^ auVar73;
                auVar103 = packssdw(auVar103,auVar103);
                if ((auVar103 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar20 + 5] = in_XMM13._0_2_;
                }
                auVar36 = auVar39 & auVar70 | auVar36;
                auVar36 = packssdw(auVar36,auVar36);
                auVar36 = packssdw(auVar36 ^ auVar73,auVar36 ^ auVar73);
                if ((auVar36 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  ptr_00[uVar20 + 6] = in_XMM13._4_2_;
                }
                auVar36 = (auVar101 | _DAT_00903ac0) ^ auVar42;
                iVar67 = -(uint)(iVar81 < auVar36._0_4_);
                auVar71._4_4_ = -(uint)(iVar92 < auVar36._4_4_);
                iVar79 = -(uint)(iVar94 < auVar36._8_4_);
                auVar71._12_4_ = -(uint)(iVar95 < auVar36._12_4_);
                auVar40._4_4_ = iVar67;
                auVar40._0_4_ = iVar67;
                auVar40._8_4_ = iVar79;
                auVar40._12_4_ = iVar79;
                iVar67 = -(uint)(auVar36._4_4_ == iVar92);
                iVar79 = -(uint)(auVar36._12_4_ == iVar95);
                auVar58._4_4_ = iVar67;
                auVar58._0_4_ = iVar67;
                auVar58._8_4_ = iVar79;
                auVar58._12_4_ = iVar79;
                auVar71._0_4_ = auVar71._4_4_;
                auVar71._8_4_ = auVar71._12_4_;
                auVar36 = auVar58 & auVar40 | auVar71;
                auVar36 = packssdw(auVar36,auVar36);
                auVar36 = packssdw(auVar36 ^ auVar73,auVar36 ^ auVar73);
                if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_00[uVar20 + 7] = in_XMM13._8_2_;
                }
                auVar36 = pshufhw(auVar40,auVar40,0x84);
                auVar38 = pshufhw(auVar58,auVar58,0x84);
                auVar103 = pshufhw(auVar36,auVar71,0x84);
                auVar36 = (auVar103 | auVar38 & auVar36) ^ auVar73;
                auVar36 = packssdw(auVar36,auVar36);
                if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_00[uVar20 + 8] = in_XMM13._12_2_;
                }
                uVar20 = uVar20 + 8;
                iVar19 = iVar19 + gap * -8;
                uVar26 = uVar26 + gap * -8;
                iVar28 = iVar28 + gap * 8;
              } while ((s2Len + 7U & 0xfffffff8) != uVar20);
              alVar41 = (__m128i)psubsw((undefined1  [16])0x0,auVar53);
              uVar26 = (int)uVar23 - 1;
              palVar17 = ptr_03 + uVar26;
              uVar20 = uVar23;
              do {
                *palVar17 = alVar41;
                auVar89._4_4_ = uVar31;
                auVar89._0_4_ = uVar31;
                auVar89._8_4_ = uVar31;
                auVar89._12_4_ = uVar31;
                alVar41 = (__m128i)psubsw((undefined1  [16])alVar41,auVar89);
                palVar17 = palVar17 + -1;
                iVar28 = (int)uVar20;
                uVar25 = iVar28 - 1;
                uVar20 = (ulong)uVar25;
              } while (uVar25 != 0 && 0 < iVar28);
              lVar18 = uVar23 * uVar54;
              local_f8 = 0;
              uVar20 = 0;
              auVar11._4_4_ = uVar32;
              auVar11._0_4_ = uVar32;
              auVar11._8_4_ = uVar32;
              auVar11._12_4_ = uVar32;
              local_78 = auVar34._0_2_;
              uStack_76 = auVar34._2_2_;
              auVar34 = auVar11;
              uVar55 = local_78;
              uVar59 = uStack_76;
              uVar60 = local_78;
              uVar61 = uStack_76;
              uVar62 = local_78;
              uVar63 = uStack_76;
              uVar64 = local_78;
              uVar65 = uStack_76;
              do {
                uVar10 = ptr_02[uVar26][0];
                auVar98._8_8_ = ptr_02[uVar26][1] << 0x10 | uVar10 >> 0x30;
                auVar98._0_8_ = uVar10 << 0x10 | (ulong)(ushort)ptr_00[uVar20];
                iVar28 = ppVar5->mapper[(byte)s2[uVar20]];
                auVar72 = psubsw(auVar11,(undefined1  [16])*ptr_03);
                lVar21 = 0;
                auVar42 = auVar11;
                do {
                  auVar89 = *(undefined1 (*) [16])((long)*ptr_02 + lVar21);
                  auVar82 = paddsw(auVar98,*(undefined1 (*) [16])
                                            ((long)pvVar4 + lVar21 + (long)iVar28 * uVar23 * 0x10));
                  auVar73 = paddsw(auVar72,*(undefined1 (*) [16])((long)*ptr_03 + lVar21));
                  auVar8._4_4_ = uVar31;
                  auVar8._0_4_ = uVar31;
                  auVar8._8_4_ = uVar31;
                  auVar8._12_4_ = uVar31;
                  auVar36 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar21),auVar8);
                  sVar51 = auVar73._0_2_;
                  sVar30 = auVar42._0_2_;
                  auVar83._0_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar73._2_2_;
                  sVar30 = auVar42._2_2_;
                  auVar83._2_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar73._4_2_;
                  sVar30 = auVar42._4_2_;
                  auVar83._4_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar73._6_2_;
                  sVar30 = auVar42._6_2_;
                  auVar83._6_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar73._8_2_;
                  sVar30 = auVar42._8_2_;
                  auVar83._8_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar73._10_2_;
                  sVar30 = auVar42._10_2_;
                  auVar83._10_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar73._12_2_;
                  sVar30 = auVar42._12_2_;
                  sVar50 = auVar42._14_2_;
                  auVar83._12_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar73._14_2_;
                  auVar83._14_2_ =
                       (ushort)(sVar50 < sVar51) * sVar51 | (ushort)(sVar50 >= sVar51) * sVar50;
                  auVar42 = psubsw(auVar89,auVar53);
                  sVar51 = auVar36._0_2_;
                  sVar30 = auVar42._0_2_;
                  uVar29 = (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar36._2_2_;
                  sVar30 = auVar42._2_2_;
                  uVar43 = (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar36._4_2_;
                  sVar30 = auVar42._4_2_;
                  uVar44 = (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar36._6_2_;
                  sVar30 = auVar42._6_2_;
                  uVar45 = (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar36._8_2_;
                  sVar30 = auVar42._8_2_;
                  uVar46 = (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar36._10_2_;
                  sVar30 = auVar42._10_2_;
                  uVar47 = (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar36._12_2_;
                  sVar30 = auVar42._12_2_;
                  sVar50 = auVar42._14_2_;
                  uVar48 = (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar36._14_2_;
                  uVar49 = (ushort)(sVar50 < sVar51) * sVar51 | (ushort)(sVar50 >= sVar51) * sVar50;
                  sVar51 = auVar82._0_2_;
                  uVar66 = (sVar51 < (short)uVar29) * uVar29 |
                           (ushort)(sVar51 >= (short)uVar29) * sVar51;
                  sVar51 = auVar82._2_2_;
                  uVar76 = (sVar51 < (short)uVar43) * uVar43 |
                           (ushort)(sVar51 >= (short)uVar43) * sVar51;
                  sVar51 = auVar82._4_2_;
                  uVar77 = (sVar51 < (short)uVar44) * uVar44 |
                           (ushort)(sVar51 >= (short)uVar44) * sVar51;
                  sVar51 = auVar82._6_2_;
                  uVar78 = (sVar51 < (short)uVar45) * uVar45 |
                           (ushort)(sVar51 >= (short)uVar45) * sVar51;
                  auVar72._0_8_ = CONCAT26(uVar78,CONCAT24(uVar77,CONCAT22(uVar76,uVar66)));
                  sVar51 = auVar82._8_2_;
                  auVar72._8_2_ =
                       (sVar51 < (short)uVar46) * uVar46 |
                       (ushort)(sVar51 >= (short)uVar46) * sVar51;
                  sVar51 = auVar82._10_2_;
                  auVar72._10_2_ =
                       (sVar51 < (short)uVar47) * uVar47 |
                       (ushort)(sVar51 >= (short)uVar47) * sVar51;
                  sVar51 = auVar82._12_2_;
                  sVar30 = auVar82._14_2_;
                  auVar72._12_2_ =
                       (sVar51 < (short)uVar48) * uVar48 |
                       (ushort)(sVar51 >= (short)uVar48) * sVar51;
                  auVar72._14_2_ =
                       (sVar30 < (short)uVar49) * uVar49 |
                       (ushort)(sVar30 >= (short)uVar49) * sVar30;
                  puVar2 = (ushort *)((long)*ptr + lVar21);
                  *puVar2 = uVar29;
                  puVar2[1] = uVar43;
                  puVar2[2] = uVar44;
                  puVar2[3] = uVar45;
                  puVar2[4] = uVar46;
                  puVar2[5] = uVar47;
                  puVar2[6] = uVar48;
                  puVar2[7] = uVar49;
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar21) = auVar72;
                  lVar21 = lVar21 + 0x10;
                  auVar42 = auVar83;
                  auVar98 = auVar89;
                } while (uVar23 << 4 != lVar21);
                auVar74._8_8_ = auVar72._8_8_ << 0x10 | (ulong)uVar78;
                uVar29 = ptr_00[uVar20 + 1];
                auVar74._0_8_ = auVar72._0_8_ << 0x10 | (ulong)uVar29;
                uVar20 = uVar20 + 1;
                auVar42 = paddsw((undefined1  [16])*ptr_03,auVar74);
                sVar51 = auVar42._0_2_;
                auVar84._0_2_ =
                     (ushort)((short)auVar83._0_2_ < sVar51) * sVar51 |
                     ((short)auVar83._0_2_ >= sVar51) * auVar83._0_2_;
                sVar51 = auVar42._2_2_;
                auVar84._2_2_ =
                     (ushort)((short)auVar83._2_2_ < sVar51) * sVar51 |
                     ((short)auVar83._2_2_ >= sVar51) * auVar83._2_2_;
                sVar51 = auVar42._4_2_;
                auVar84._4_2_ =
                     (ushort)((short)auVar83._4_2_ < sVar51) * sVar51 |
                     ((short)auVar83._4_2_ >= sVar51) * auVar83._4_2_;
                sVar51 = auVar42._6_2_;
                auVar84._6_2_ =
                     (ushort)((short)auVar83._6_2_ < sVar51) * sVar51 |
                     ((short)auVar83._6_2_ >= sVar51) * auVar83._6_2_;
                sVar51 = auVar42._8_2_;
                auVar84._8_2_ =
                     (ushort)((short)auVar83._8_2_ < sVar51) * sVar51 |
                     ((short)auVar83._8_2_ >= sVar51) * auVar83._8_2_;
                sVar51 = auVar42._10_2_;
                auVar84._10_2_ =
                     (ushort)((short)auVar83._10_2_ < sVar51) * sVar51 |
                     ((short)auVar83._10_2_ >= sVar51) * auVar83._10_2_;
                sVar51 = auVar42._12_2_;
                auVar84._12_2_ =
                     (ushort)((short)auVar83._12_2_ < sVar51) * sVar51 |
                     ((short)auVar83._12_2_ >= sVar51) * auVar83._12_2_;
                sVar51 = auVar42._14_2_;
                auVar84._14_2_ =
                     (ushort)((short)auVar83._14_2_ < sVar51) * sVar51 |
                     ((short)auVar83._14_2_ >= sVar51) * auVar83._14_2_;
                iVar28 = 6;
                do {
                  auVar85._0_8_ = auVar84._0_8_ << 0x10;
                  auVar85._8_8_ = auVar84._8_8_ << 0x10 | auVar84._0_8_ >> 0x30;
                  auVar42 = paddsw(auVar85,auVar35);
                  sVar51 = auVar84._0_2_;
                  sVar80 = auVar42._0_2_;
                  sVar30 = auVar84._2_2_;
                  sVar90 = auVar42._2_2_;
                  sVar50 = auVar84._4_2_;
                  sVar91 = auVar42._4_2_;
                  sVar7 = auVar84._6_2_;
                  sVar93 = auVar42._6_2_;
                  uVar43 = (ushort)(sVar93 < sVar7) * sVar7 | (ushort)(sVar93 >= sVar7) * sVar93;
                  auVar86._0_8_ =
                       CONCAT26(uVar43,CONCAT24((ushort)(sVar91 < sVar50) * sVar50 |
                                                (ushort)(sVar91 >= sVar50) * sVar91,
                                                CONCAT22((ushort)(sVar90 < sVar30) * sVar30 |
                                                         (ushort)(sVar90 >= sVar30) * sVar90,
                                                         (ushort)(sVar80 < sVar51) * sVar51 |
                                                         (ushort)(sVar80 >= sVar51) * sVar80)));
                  sVar51 = auVar84._8_2_;
                  sVar30 = auVar42._8_2_;
                  auVar86._8_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar84._10_2_;
                  sVar30 = auVar42._10_2_;
                  auVar86._10_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar84._12_2_;
                  sVar30 = auVar42._12_2_;
                  sVar50 = auVar42._14_2_;
                  auVar86._12_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar84._14_2_;
                  auVar86._14_2_ =
                       (ushort)(sVar50 < sVar51) * sVar51 | (ushort)(sVar50 >= sVar51) * sVar50;
                  iVar28 = iVar28 + -1;
                  auVar84 = auVar86;
                } while (iVar28 != 0);
                auVar87._0_8_ = auVar86._0_8_ << 0x10;
                auVar87._8_8_ = auVar86._8_8_ << 0x10 | (ulong)uVar43;
                auVar88 = paddsw(auVar87,ZEXT416(uVar16 & 0xffff));
                sVar51 = auVar88._0_2_;
                auVar75._0_2_ =
                     (ushort)((short)uVar29 < sVar51) * sVar51 | ((short)uVar29 >= sVar51) * uVar29;
                sVar51 = auVar88._2_2_;
                auVar75._2_2_ =
                     (ushort)((short)uVar66 < sVar51) * sVar51 | ((short)uVar66 >= sVar51) * uVar66;
                sVar51 = auVar88._4_2_;
                auVar75._4_2_ =
                     (ushort)((short)uVar76 < sVar51) * sVar51 | ((short)uVar76 >= sVar51) * uVar76;
                sVar51 = auVar88._6_2_;
                auVar75._6_2_ =
                     (ushort)((short)uVar77 < sVar51) * sVar51 | ((short)uVar77 >= sVar51) * uVar77;
                sVar51 = auVar88._8_2_;
                auVar75._8_2_ =
                     (ushort)((short)uVar78 < sVar51) * sVar51 | ((short)uVar78 >= sVar51) * uVar78;
                sVar51 = auVar88._10_2_;
                auVar75._10_2_ =
                     (ushort)((short)auVar72._8_2_ < sVar51) * sVar51 |
                     ((short)auVar72._8_2_ >= sVar51) * auVar72._8_2_;
                sVar51 = auVar88._12_2_;
                auVar75._12_2_ =
                     (ushort)((short)auVar72._10_2_ < sVar51) * sVar51 |
                     ((short)auVar72._10_2_ >= sVar51) * auVar72._10_2_;
                sVar51 = auVar88._14_2_;
                auVar75._14_2_ =
                     (ushort)((short)auVar72._12_2_ < sVar51) * sVar51 |
                     ((short)auVar72._12_2_ >= sVar51) * auVar72._12_2_;
                lVar27 = 0;
                lVar21 = local_f8;
                auVar42 = auVar34;
                do {
                  auVar9._4_4_ = uVar31;
                  auVar9._0_4_ = uVar31;
                  auVar9._8_4_ = uVar31;
                  auVar9._12_4_ = uVar31;
                  auVar89 = psubsw(auVar88,auVar9);
                  auVar34 = psubsw(auVar75,auVar53);
                  sVar51 = auVar34._0_2_;
                  sVar30 = auVar89._0_2_;
                  auVar88._0_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar34._2_2_;
                  sVar30 = auVar89._2_2_;
                  auVar88._2_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar34._4_2_;
                  sVar30 = auVar89._4_2_;
                  auVar88._4_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar34._6_2_;
                  sVar30 = auVar89._6_2_;
                  auVar88._6_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar34._8_2_;
                  sVar30 = auVar89._8_2_;
                  auVar88._8_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar34._10_2_;
                  sVar30 = auVar89._10_2_;
                  auVar88._10_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar34._12_2_;
                  sVar30 = auVar89._12_2_;
                  sVar50 = auVar89._14_2_;
                  auVar88._12_2_ =
                       (ushort)(sVar30 < sVar51) * sVar51 | (ushort)(sVar30 >= sVar51) * sVar30;
                  sVar51 = auVar34._14_2_;
                  auVar88._14_2_ =
                       (ushort)(sVar50 < sVar51) * sVar51 | (ushort)(sVar50 >= sVar51) * sVar50;
                  psVar3 = (short *)((long)*ptr_01 + lVar27);
                  sVar51 = *psVar3;
                  sVar30 = psVar3[1];
                  sVar50 = psVar3[2];
                  sVar7 = psVar3[3];
                  sVar80 = psVar3[4];
                  sVar90 = psVar3[5];
                  sVar91 = psVar3[6];
                  sVar93 = psVar3[7];
                  auVar75._0_2_ =
                       (sVar51 < (short)auVar88._0_2_) * auVar88._0_2_ |
                       (ushort)(sVar51 >= (short)auVar88._0_2_) * sVar51;
                  auVar75._2_2_ =
                       (sVar30 < (short)auVar88._2_2_) * auVar88._2_2_ |
                       (ushort)(sVar30 >= (short)auVar88._2_2_) * sVar30;
                  auVar75._4_2_ =
                       (sVar50 < (short)auVar88._4_2_) * auVar88._4_2_ |
                       (ushort)(sVar50 >= (short)auVar88._4_2_) * sVar50;
                  auVar75._6_2_ =
                       (sVar7 < (short)auVar88._6_2_) * auVar88._6_2_ |
                       (ushort)(sVar7 >= (short)auVar88._6_2_) * sVar7;
                  auVar75._8_2_ =
                       (sVar80 < (short)auVar88._8_2_) * auVar88._8_2_ |
                       (ushort)(sVar80 >= (short)auVar88._8_2_) * sVar80;
                  auVar75._10_2_ =
                       (sVar90 < (short)auVar88._10_2_) * auVar88._10_2_ |
                       (ushort)(sVar90 >= (short)auVar88._10_2_) * sVar90;
                  auVar75._12_2_ =
                       (sVar91 < (short)auVar88._12_2_) * auVar88._12_2_ |
                       (ushort)(sVar91 >= (short)auVar88._12_2_) * sVar91;
                  auVar75._14_2_ =
                       (sVar93 < (short)auVar88._14_2_) * auVar88._14_2_ |
                       (ushort)(sVar93 >= (short)auVar88._14_2_) * sVar93;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar27) = auVar75;
                  piVar6 = ((ppVar14->field_4).rowcols)->score_row;
                  *(int *)((long)piVar6 + lVar21) = (int)(short)auVar75._0_2_;
                  *(int *)((long)piVar6 + lVar18 * 4 + lVar21) = (int)(short)auVar75._2_2_;
                  *(int *)((long)piVar6 + lVar18 * 8 + lVar21) = (int)(short)auVar75._4_2_;
                  *(int *)((long)piVar6 + lVar18 * 0xc + lVar21) = (int)(short)auVar75._6_2_;
                  *(int *)((long)piVar6 + lVar18 * 0x10 + lVar21) = (int)(short)auVar75._8_2_;
                  *(int *)((long)piVar6 + lVar18 * 0x14 + lVar21) = (int)(short)auVar75._10_2_;
                  *(int *)((long)piVar6 + lVar18 * 0x18 + lVar21) = (int)(short)auVar75._12_2_;
                  *(int *)((long)piVar6 + lVar18 * 0x1c + lVar21) = (int)(short)auVar75._14_2_;
                  uVar55 = ((short)auVar75._0_2_ < (short)uVar55) * auVar75._0_2_ |
                           ((short)auVar75._0_2_ >= (short)uVar55) * uVar55;
                  uVar59 = ((short)auVar75._2_2_ < (short)uVar59) * auVar75._2_2_ |
                           ((short)auVar75._2_2_ >= (short)uVar59) * uVar59;
                  uVar60 = ((short)auVar75._4_2_ < (short)uVar60) * auVar75._4_2_ |
                           ((short)auVar75._4_2_ >= (short)uVar60) * uVar60;
                  uVar61 = ((short)auVar75._6_2_ < (short)uVar61) * auVar75._6_2_ |
                           ((short)auVar75._6_2_ >= (short)uVar61) * uVar61;
                  uVar62 = ((short)auVar75._8_2_ < (short)uVar62) * auVar75._8_2_ |
                           ((short)auVar75._8_2_ >= (short)uVar62) * uVar62;
                  uVar63 = ((short)auVar75._10_2_ < (short)uVar63) * auVar75._10_2_ |
                           ((short)auVar75._10_2_ >= (short)uVar63) * uVar63;
                  uVar64 = ((short)auVar75._12_2_ < (short)uVar64) * auVar75._12_2_ |
                           ((short)auVar75._12_2_ >= (short)uVar64) * uVar64;
                  uVar65 = ((short)auVar75._14_2_ < (short)uVar65) * auVar75._14_2_ |
                           ((short)auVar75._14_2_ >= (short)uVar65) * uVar65;
                  sVar51 = auVar42._0_2_;
                  auVar34._0_2_ =
                       (sVar51 < (short)auVar75._0_2_) * auVar75._0_2_ |
                       (ushort)(sVar51 >= (short)auVar75._0_2_) * sVar51;
                  sVar51 = auVar42._2_2_;
                  auVar34._2_2_ =
                       (sVar51 < (short)auVar75._2_2_) * auVar75._2_2_ |
                       (ushort)(sVar51 >= (short)auVar75._2_2_) * sVar51;
                  sVar51 = auVar42._4_2_;
                  auVar34._4_2_ =
                       (sVar51 < (short)auVar75._4_2_) * auVar75._4_2_ |
                       (ushort)(sVar51 >= (short)auVar75._4_2_) * sVar51;
                  sVar51 = auVar42._6_2_;
                  auVar34._6_2_ =
                       (sVar51 < (short)auVar75._6_2_) * auVar75._6_2_ |
                       (ushort)(sVar51 >= (short)auVar75._6_2_) * sVar51;
                  sVar51 = auVar42._8_2_;
                  auVar34._8_2_ =
                       (sVar51 < (short)auVar75._8_2_) * auVar75._8_2_ |
                       (ushort)(sVar51 >= (short)auVar75._8_2_) * sVar51;
                  sVar51 = auVar42._10_2_;
                  auVar34._10_2_ =
                       (sVar51 < (short)auVar75._10_2_) * auVar75._10_2_ |
                       (ushort)(sVar51 >= (short)auVar75._10_2_) * sVar51;
                  sVar51 = auVar42._12_2_;
                  sVar30 = auVar42._14_2_;
                  auVar34._12_2_ =
                       (sVar51 < (short)auVar75._12_2_) * auVar75._12_2_ |
                       (ushort)(sVar51 >= (short)auVar75._12_2_) * sVar51;
                  auVar34._14_2_ =
                       (sVar30 < (short)auVar75._14_2_) * auVar75._14_2_ |
                       (ushort)(sVar30 >= (short)auVar75._14_2_) * sVar30;
                  lVar27 = lVar27 + 0x10;
                  lVar21 = lVar21 + uVar54 * 4;
                  auVar42 = auVar34;
                } while (uVar23 << 4 != lVar27);
                local_f8 = local_f8 + 4;
              } while (uVar20 != uVar54);
              uVar54 = ptr_02[(ulong)uVar12 % uVar23][1];
              if (iVar13 < 7) {
                iVar28 = 0;
                uVar23 = ptr_02[(ulong)uVar12 % uVar23][0];
                do {
                  uVar54 = uVar54 << 0x10 | uVar23 >> 0x30;
                  iVar28 = iVar28 + 1;
                  uVar23 = uVar23 << 0x10;
                } while (iVar28 < 7 - iVar13);
              }
              sVar51 = auVar33._0_2_;
              auVar100._0_2_ = -(ushort)((short)uVar55 < sVar51);
              sVar30 = auVar33._2_2_;
              auVar100._2_2_ = -(ushort)((short)uVar59 < sVar30);
              auVar100._4_2_ = -(ushort)((short)uVar60 < sVar51);
              auVar100._6_2_ = -(ushort)((short)uVar61 < sVar30);
              auVar100._8_2_ = -(ushort)((short)uVar62 < sVar51);
              auVar100._10_2_ = -(ushort)((short)uVar63 < sVar30);
              auVar100._12_2_ = -(ushort)((short)uVar64 < sVar51);
              auVar100._14_2_ = -(ushort)((short)uVar65 < sVar30);
              auVar52._0_2_ = -(ushort)((short)local_78 < (short)auVar34._0_2_);
              auVar52._2_2_ = -(ushort)((short)uStack_76 < (short)auVar34._2_2_);
              auVar52._4_2_ = -(ushort)((short)local_78 < (short)auVar34._4_2_);
              auVar52._6_2_ = -(ushort)((short)uStack_76 < (short)auVar34._6_2_);
              auVar52._8_2_ = -(ushort)((short)local_78 < (short)auVar34._8_2_);
              auVar52._10_2_ = -(ushort)((short)uStack_76 < (short)auVar34._10_2_);
              auVar52._12_2_ = -(ushort)((short)local_78 < (short)auVar34._12_2_);
              auVar52._14_2_ = -(ushort)((short)uStack_76 < (short)auVar34._14_2_);
              auVar52 = auVar52 | auVar100;
              if ((((((((((((((((auVar52 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar52 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar52 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar52 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar52 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar52 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar52 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar52 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar52 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar52 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar52 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar52 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar52[0xf]) {
                sVar51 = (short)(uVar54 >> 0x30);
              }
              else {
                *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                sVar51 = 0;
                iVar15 = 0;
                uVar12 = 0;
              }
              ppVar14->score = (int)sVar51;
              ppVar14->end_query = uVar12;
              ppVar14->end_ref = iVar15;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar14;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}